

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O1

void __thiscall
chrono::ChOptimizerGradient::ChOptimizerGradient
          (ChOptimizerGradient *this,ChOptimizerGradient *other)

{
  ChOptimizer::ChOptimizer(&this->super_ChOptimizer,&other->super_ChOptimizer);
  (this->super_ChOptimizer)._vptr_ChOptimizer = (_func_int **)&PTR__ChOptimizer_00b628a0;
  this->initial_step = other->initial_step;
  this->arg_tol = other->arg_tol;
  this->fun_tol = other->fun_tol;
  this->maxevaluations = other->maxevaluations;
  this->maxgradients = other->maxgradients;
  this->maxdilationsteps = other->maxdilationsteps;
  this->maxbisections = other->maxbisections;
  this->dilation = other->dilation;
  this->do_conjugate = other->do_conjugate;
  return;
}

Assistant:

ChOptimizerGradient::ChOptimizerGradient(const ChOptimizerGradient& other) : ChOptimizer(other) {
    initial_step = other.initial_step;
    arg_tol = other.arg_tol;
    fun_tol = other.fun_tol;
    maxevaluations = other.maxevaluations;
    maxgradients = other.maxgradients;
    maxdilationsteps = other.maxdilationsteps;
    maxbisections = other.maxbisections;
    dilation = other.dilation;
    do_conjugate = other.do_conjugate;
}